

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O0

void Gia_RsbPrint(Gia_RsbMan_t *p)

{
  FILE *pFile;
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint local_30;
  int nLeaves;
  int i;
  int n;
  Vec_Int_t *vLevel [2];
  Gia_RsbMan_t *p_local;
  
  iVar1 = Vec_IntSize(p->vObjs);
  iVar1 = 1 << ((byte)iVar1 & 0x1f);
  iVar2 = Vec_WecSize(p->vSets[0]);
  if (iVar2 != iVar1) {
    __assert_fail("Vec_WecSize(p->vSets[0]) == nLeaves",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSimBase.c"
                  ,0x5a7,"void Gia_RsbPrint(Gia_RsbMan_t *)");
  }
  iVar2 = Vec_WecSize(p->vSets[1]);
  if (iVar2 == iVar1) {
    uVar3 = Vec_IntSize(p->vObjs);
    uVar4 = Gia_RsbCost(p);
    printf("Database for %d objects and cost %d:\n",(ulong)uVar3,(ulong)uVar4);
    for (local_30 = 0; uVar3 = local_30, iVar1 = Vec_WecSize(p->vSets[0]), (int)uVar3 < iVar1;
        local_30 = local_30 + 1) {
      _i = Vec_WecEntry(p->vSets[0],local_30);
      vLevel[0] = Vec_WecEntry(p->vSets[1],local_30);
      for (nLeaves = 0; nLeaves < 2; nLeaves = nLeaves + 1) {
        printf("%5d : ",(ulong)local_30);
        pFile = _stdout;
        iVar1 = Vec_IntSize(p->vObjs);
        Extra_PrintBinary2(pFile,&local_30,iVar1);
        printf(" %d ",(ulong)(uint)nLeaves);
        Vec_IntPrint(*(Vec_Int_t **)(&i + (long)nLeaves * 2));
      }
    }
    return;
  }
  __assert_fail("Vec_WecSize(p->vSets[1]) == nLeaves",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSimBase.c"
                ,0x5a8,"void Gia_RsbPrint(Gia_RsbMan_t *)");
}

Assistant:

void Gia_RsbPrint( Gia_RsbMan_t * p )
{
    Vec_Int_t * vLevel[2]; 
    int n, i, nLeaves = 1 << Vec_IntSize(p->vObjs);
    assert( Vec_WecSize(p->vSets[0]) == nLeaves );
    assert( Vec_WecSize(p->vSets[1]) == nLeaves );
    printf( "Database for %d objects and cost %d:\n", Vec_IntSize(p->vObjs), Gia_RsbCost(p) );
    Vec_WecForEachLevelTwo( p->vSets[0], p->vSets[1], vLevel[0], vLevel[1], i )
    {
        for ( n = 0; n < 2; n++ )
        {
            printf( "%5d : ", i );
            Extra_PrintBinary2( stdout, (unsigned*)&i, Vec_IntSize(p->vObjs) ); printf( " %d ", n );
            Vec_IntPrint( vLevel[n] );
        }
    }    
}